

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O0

void __thiscall fmcalc::init_fmxref(fmcalc *this)

{
  FILE *__stream;
  mapped_type mVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  undefined8 uVar5;
  mapped_type *pmVar6;
  key_type local_f0;
  fmxref_key k;
  size_t i;
  int local_d8;
  fmXref f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [55];
  allocator local_39;
  string local_38 [8];
  string file;
  FILE *local_18;
  FILE *fin;
  fmcalc *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"input/fm_xref_a0.bin",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  lVar3 = std::__cxx11::string::length();
  if (lVar3 != 0) {
    std::__cxx11::string::substr((ulong)local_90,(ulong)local_38);
    std::operator+(local_70,&this->inputpath_);
    std::__cxx11::string::operator=(local_38,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string(local_90);
  }
  if ((this->allocrule_ == 0) && (bVar2 = fileexists(this,(string *)local_38), bVar2)) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    local_18 = fopen(pcVar4,"rb");
  }
  else {
    std::__cxx11::string::operator=(local_38,"input/fm_xref.bin");
    lVar3 = std::__cxx11::string::length();
    if (lVar3 != 0) {
      std::__cxx11::string::substr((ulong)&f.agg_id,(ulong)local_38);
      std::operator+(local_b0,&this->inputpath_);
      std::__cxx11::string::operator=(local_38,(string *)local_b0);
      std::__cxx11::string::~string((string *)local_b0);
      std::__cxx11::string::~string((string *)&f.agg_id);
    }
    pcVar4 = (char *)std::__cxx11::string::c_str();
    local_18 = fopen(pcVar4,"rb");
  }
  __stream = _stderr;
  if (local_18 != (FILE *)0x0) {
    k = (fmxref_key)fread((void *)((long)&i + 4),0xc,1,local_18);
    while (mVar1 = i._4_4_, k != (fmxref_key)0x0) {
      local_f0.agg_id = local_d8;
      local_f0.layer_id = f.output_id;
      pmVar6 = std::
               map<fmxref_key,_int,_std::less<fmxref_key>,_std::allocator<std::pair<const_fmxref_key,_int>_>_>
               ::operator[](&fm_xrefmap,&local_f0);
      *pmVar6 = mVar1;
      k = (fmxref_key)fread((void *)((long)&i + 4),0xc,1,local_18);
    }
    fclose(local_18);
    std::__cxx11::string::~string(local_38);
    return;
  }
  uVar5 = std::__cxx11::string::c_str();
  fprintf(__stream,"FATAL: %s: cannot open %s\n","init_fmxref",uVar5);
  exit(1);
}

Assistant:

void fmcalc::init_fmxref()
{
	FILE *fin = NULL;
	std::string file = FMXREF_FILE_A0;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	if (allocrule_ == 0  && fileexists(file) ) {		
		fin = fopen(file.c_str(), "rb");
	}
	else {
		file = FMXREF_FILE;
		if (inputpath_.length() > 0) {
			file = inputpath_ + file.substr(5);
		}
		fin = fopen(file.c_str(), "rb");
	}
	
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}

	fmXref f;
	size_t i = fread(&f, sizeof(f), 1, fin);
	while (i != 0) {
		fmxref_key k;
		k.agg_id = f.agg_id;
		k.layer_id = f.layer_id;
/*
		if (k.agg_id == f.output_id && k.layer_id == 1) {
			// skip it
		}else {
			fm_xrefmap[k] = f.output_id;
		}
*/
		fm_xrefmap[k] = f.output_id;
		i = fread(&f, sizeof(f),  1, fin);
	}
	fclose(fin);	
}